

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O1

size_t __thiscall CoreML::Specification::SerializedModel::ByteSizeLong(SerializedModel *this)

{
  size_type sVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  
  sVar1 = ((this->identifier_).ptr_)->_M_string_length;
  if (sVar1 == 0) {
    sVar3 = 0;
  }
  else {
    uVar4 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar3 = sVar1 + (iVar2 * 9 + 0x49U >> 6) + 1;
  }
  sVar1 = ((this->model_).ptr_)->_M_string_length;
  if (sVar1 != 0) {
    uVar4 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar3 = sVar3 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

inline const ::std::string& GetNoArena() const { return *ptr_; }